

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

Estimate<double> *
Catch::Benchmark::Detail::bootstrap
          (Estimate<double> *__return_storage_ptr__,double confidence_level,double *first,
          double *last,sample *resample,_func_double_double_ptr_double_ptr *estimator)

{
  double *pdVar1;
  pointer pdVar2;
  sample *psVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  iterator __begin2;
  pointer pdVar7;
  double *it;
  iterator __end2;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  anon_class_8_1_54a3980e cumn;
  sample jack;
  anon_class_8_1_54a3980e local_70;
  _Vector_base<double,_std::allocator<double>_> local_68;
  double local_50;
  double local_48;
  sample *local_40;
  Estimate<double> *local_38;
  
  dVar9 = (*estimator)(first,last);
  if ((long)last - (long)first == 8) {
    __return_storage_ptr__->point = dVar9;
    __return_storage_ptr__->lower_bound = dVar9;
    __return_storage_ptr__->upper_bound = dVar9;
    __return_storage_ptr__->confidence_interval = confidence_level;
  }
  else {
    local_68._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (double *)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_40 = resample;
    local_38 = __return_storage_ptr__;
    std::vector<double,_std::allocator<double>_>::reserve
              ((vector<double,_std::allocator<double>_> *)&local_68,(long)last - (long)first >> 3);
    for (pdVar4 = first; pdVar2 = local_68._M_impl.super__Vector_impl_data._M_finish,
        pdVar7 = local_68._M_impl.super__Vector_impl_data._M_start, pdVar4 != last;
        pdVar4 = pdVar4 + 1) {
      dVar10 = *pdVar4;
      *pdVar4 = *first;
      *first = dVar10;
      local_70.n = (long)(*estimator)(first + 1,last);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                ((vector<double,_std::allocator<double>_> *)&local_68,(double *)&local_70);
    }
    dVar10 = mean(local_68._M_impl.super__Vector_impl_data._M_start,
                  local_68._M_impl.super__Vector_impl_data._M_finish);
    __return_storage_ptr__ = local_38;
    psVar3 = local_40;
    dVar15 = 0.0;
    dVar13 = 0.0;
    for (; pdVar7 != pdVar2; pdVar7 = pdVar7 + 1) {
      dVar11 = dVar10 - *pdVar7;
      dVar13 = dVar13 + dVar11 * dVar11;
      dVar15 = dVar15 + dVar11 * dVar11 * dVar11;
    }
    dVar10 = pow(dVar13,1.5);
    pdVar4 = (psVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1 = (psVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    lVar8 = (long)pdVar1 - (long)pdVar4;
    lVar6 = 0;
    for (; pdVar4 != pdVar1; pdVar4 = pdVar4 + 1) {
      lVar6 = lVar6 + (ulong)(*pdVar4 <= dVar9 && dVar9 != *pdVar4);
    }
    dVar13 = (double)(lVar8 >> 3);
    dVar11 = (double)lVar6 / (double)(long)dVar13;
    if ((dVar11 != 0.0) || (dVar12 = dVar9, dVar14 = dVar9, NAN(dVar11))) {
      local_48 = dVar10 * -6.0;
      local_50 = normal_quantile(dVar11);
      dVar10 = normal_quantile((1.0 - confidence_level) * 0.5);
      dVar11 = (local_50 - dVar10) / ((dVar15 / local_48) * (local_50 - dVar10) + 1.0) + local_50;
      local_70.n = (long)dVar13;
      lVar8 = bootstrap::anon_class_8_1_54a3980e::operator()
                        (&local_70,
                         (local_50 + dVar10) / ((dVar15 / local_48) * (local_50 + dVar10) + 1.0) +
                         local_50);
      lVar6 = 0;
      if (0 < lVar8) {
        lVar6 = lVar8;
      }
      lVar5 = bootstrap::anon_class_8_1_54a3980e::operator()(&local_70,dVar11);
      lVar8 = (long)dVar13 + -1;
      if (lVar5 <= (long)dVar13 + -1) {
        lVar8 = lVar5;
      }
      pdVar7 = (psVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar12 = pdVar7[lVar6];
      dVar14 = pdVar7[lVar8];
    }
    __return_storage_ptr__->point = dVar9;
    __return_storage_ptr__->lower_bound = dVar12;
    __return_storage_ptr__->upper_bound = dVar14;
    __return_storage_ptr__->confidence_interval = confidence_level;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

Estimate<double>
            bootstrap( double confidence_level,
                       double* first,
                       double* last,
                       sample const& resample,
                       double ( *estimator )( double const*, double const* ) ) {
                auto n_samples = last - first;

                double point = estimator( first, last );
                // Degenerate case with a single sample
                if ( n_samples == 1 )
                    return { point, point, point, confidence_level };

                sample jack = jackknife( estimator, first, last );
                double jack_mean =
                    mean( jack.data(), jack.data() + jack.size() );
                double sum_squares = 0, sum_cubes = 0;
                for ( double x : jack ) {
                    auto difference = jack_mean - x;
                    auto square = difference * difference;
                    auto cube = square * difference;
                    sum_squares += square;
                    sum_cubes += cube;
                }

                double accel = sum_cubes / ( 6 * std::pow( sum_squares, 1.5 ) );
                long n = static_cast<long>( resample.size() );
                double prob_n =
                    std::count_if( resample.begin(),
                                   resample.end(),
                                   [point]( double x ) { return x < point; } ) /
                    static_cast<double>( n );
                // degenerate case with uniform samples
                if ( Catch::Detail::directCompare( prob_n, 0. ) ) {
                    return { point, point, point, confidence_level };
                }

                double bias = normal_quantile( prob_n );
                double z1 = normal_quantile( ( 1. - confidence_level ) / 2. );

                auto cumn = [n]( double x ) -> long {
                    return std::lround( normal_cdf( x ) *
                                        static_cast<double>( n ) );
                };
                auto a = [bias, accel]( double b ) {
                    return bias + b / ( 1. - accel * b );
                };
                double b1 = bias + z1;
                double b2 = bias - z1;
                double a1 = a( b1 );
                double a2 = a( b2 );
                auto lo = static_cast<size_t>( (std::max)( cumn( a1 ), 0l ) );
                auto hi =
                    static_cast<size_t>( (std::min)( cumn( a2 ), n - 1 ) );

                return { point, resample[lo], resample[hi], confidence_level };
            }